

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addSlot(QMetaObjectBuilder *this,QByteArray *signature)

{
  size_type sVar1;
  int index_00;
  qsizetype in_RSI;
  QMetaObjectBuilder *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar2;
  int index;
  value_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QByteArray *_returnType;
  QByteArray *in_stack_ffffffffffffff40;
  MethodType in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  QByteArray local_98 [5];
  QMetaMethodBuilder local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::size
                    (&in_RDI->d->methods);
  index_00 = (int)sVar1;
  _returnType = local_98;
  QByteArray::QByteArray(in_stack_ffffffffffffff40,(char *)_returnType,in_RSI);
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            ((QMetaMethodBuilderPrivate *)CONCAT44(index_00,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,_returnType,
             (Access)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::push_back
            ((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate
            ((QMetaMethodBuilderPrivate *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  QByteArray::~QByteArray((QByteArray *)0x371f64);
  QMetaMethodBuilder::QMetaMethodBuilder(&local_18,in_RDI,index_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2._index = local_18._index;
    QVar2._mobj = local_18._mobj;
    QVar2._12_4_ = 0;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addSlot(const QByteArray &signature)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Slot, signature));
    return QMetaMethodBuilder(this, index);
}